

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCommsInterface.cpp
# Opt level: O1

int __thiscall
helics::NetworkCommsInterface::PortAllocator::findOpenPort
          (PortAllocator *this,int count,string_view host)

{
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  *this_00;
  mapped_type mVar1;
  string_view host_00;
  string_view host_01;
  string_view host_02;
  bool bVar2;
  int iVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  char *__s1;
  _Base_ptr p_Var6;
  int port;
  size_type __rlen;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar7;
  key_type local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  p_Var6 = (_Base_ptr)host._M_len;
  __s1 = host._M_str;
  do {
    while (local_50._M_len = (size_t)p_Var6, local_50._M_str = __s1, p_Var6 != (_Base_ptr)0x3) {
      if (p_Var6 != (_Base_ptr)0x9) goto LAB_0027fb4f;
      iVar3 = bcmp(__s1,"127.0.0.1",9);
      p_Var6 = (_Base_ptr)0x9;
      __s1 = "localhost";
      if (iVar3 != 0) goto LAB_0027fb4f;
    }
    iVar3 = bcmp(__s1,"::1",3);
    p_Var6 = (_Base_ptr)0x9;
    __s1 = "localhost";
  } while (iVar3 == 0);
LAB_0027fb4f:
  this_00 = &this->nextPorts;
  iVar4 = std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
          ::find(&this_00->_M_t,&local_50);
  if ((_Rb_tree_header *)iVar4._M_node == &(this->nextPorts)._M_t._M_impl.super__Rb_tree_header) {
    iVar3 = this->startingPort;
    local_40._M_len = local_50._M_len;
    local_40._M_str = local_50._M_str;
    pVar7 = std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_emplace_unique<std::basic_string_view<char,std::char_traits<char>>&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&this->hosts,&local_40);
    local_50._M_str = *(char **)(pVar7.first._M_node._M_node + 1);
    local_50._M_len = (size_t)pVar7.first._M_node._M_node[1]._M_parent;
    mVar1 = this->startingPort;
    pmVar5 = std::
             map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
             ::operator[](this_00,&local_50);
    *pmVar5 = mVar1;
    pmVar5 = std::
             map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
             ::operator[](this_00,&local_50);
    *pmVar5 = *pmVar5 + count;
  }
  else {
    iVar3 = *(int *)&iVar4._M_node[1]._M_left;
    *(int *)&iVar4._M_node[1]._M_left = iVar3 + count;
  }
  host_00._M_str = local_50._M_str;
  host_00._M_len = local_50._M_len;
  bVar2 = isPortUsed(this,host_00,iVar3);
  if (bVar2) {
    do {
      iVar3 = iVar3 + 1;
      host_01._M_str = local_50._M_str;
      host_01._M_len = local_50._M_len;
      bVar2 = isPortUsed(this,host_01,iVar3);
    } while (bVar2);
    pmVar5 = std::
             map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
             ::operator[](this_00,&local_50);
    *pmVar5 = count + iVar3;
  }
  port = iVar3;
  if (0 < count) {
    do {
      host_02._M_str = local_50._M_str;
      host_02._M_len = local_50._M_len;
      addUsedPort(this,host_02,port);
      count = count + -1;
      port = port + 1;
    } while (count != 0);
  }
  return iVar3;
}

Assistant:

int NetworkCommsInterface::PortAllocator::findOpenPort(int count, std::string_view host)
{
    if ((host == "127.0.0.1") || (host == "::1")) {
        return findOpenPort(count, localHostString);
    }
    auto np = nextPorts.find(host);
    int nextPort = startingPort;
    if (np == nextPorts.end()) {
        host = addNewHost(host);
        nextPorts[host] = startingPort;
        nextPorts[host] += count;
    } else {
        nextPort = np->second;
        (np->second) += count;
    }
    if (isPortUsed(host, nextPort)) {
        ++nextPort;
        while (isPortUsed(host, nextPort)) {
            ++nextPort;
        }
        nextPorts[host] = nextPort + count;
    }
    for (int ii = 0; ii < count; ++ii) {
        addUsedPort(host, nextPort + ii);
    }
    return nextPort;
}